

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall PDFObjectParser::ParseDictionary(PDFObjectParser *this)

{
  bool bVar1;
  EStatusCode EVar2;
  PDFObject *pPVar3;
  PDFName *pPVar4;
  string *psVar5;
  Trace *pTVar6;
  undefined8 uVar7;
  string local_100 [32];
  string local_e0;
  string local_c0 [32];
  undefined1 local_a0 [8];
  RefCountPtr<PDFObject> aValue;
  undefined1 local_70 [8];
  PDFObjectCastPtr<PDFName> aKey;
  int local_4c;
  undefined1 local_48 [4];
  EStatusCode status;
  string token;
  bool dictionaryEndEncountered;
  PDFDictionary *aDictionary;
  PDFObjectParser *this_local;
  
  token.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_48);
  local_4c = 0;
  EVar2 = IncreaseAndCheckDepth(this);
  if (EVar2 == eSuccess) {
    this_local = (PDFObjectParser *)operator_new(0x78);
    PDFDictionary::PDFDictionary((PDFDictionary *)this_local);
    do {
      bVar1 = GetNextToken(this,(string *)local_48);
      if ((!bVar1 || local_4c != 0) ||
         (token.field_2._M_local_buf[0xf] =
               std::operator==(&scDoubleRightAngle_abi_cxx11_,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_48), (bool)token.field_2._M_local_buf[0xf])) break;
      ReturnTokenToBuffer(this,(string *)local_48);
      pPVar3 = ParseNewObject(this);
      PDFObjectCastPtr<PDFName>::PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_70,pPVar3);
      bVar1 = RefCountPtr<PDFName>::operator!((RefCountPtr<PDFName> *)local_70);
      if (bVar1) {
        local_4c = -1;
        pTVar6 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)&aValue.mValue,(ulong)local_48);
        uVar7 = std::__cxx11::string::c_str();
        Trace::TraceToLog(pTVar6,
                          "PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s"
                          ,uVar7);
        std::__cxx11::string::~string((string *)&aValue.mValue);
        aKey.super_RefCountPtr<PDFName>.mValue._0_4_ = 3;
      }
      else {
        pPVar3 = ParseNewObject(this);
        RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_a0,pPVar3);
        bVar1 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_a0);
        if (bVar1) {
          local_4c = -1;
          pTVar6 = Trace::DefaultTrace();
          std::__cxx11::string::substr((ulong)local_c0,(ulong)local_48);
          uVar7 = std::__cxx11::string::c_str();
          Trace::TraceToLog(pTVar6,
                            "PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s"
                            ,uVar7);
          std::__cxx11::string::~string(local_c0);
          aKey.super_RefCountPtr<PDFName>.mValue._0_4_ = 3;
        }
        else {
          pPVar4 = RefCountPtr<PDFName>::operator->((RefCountPtr<PDFName> *)local_70);
          psVar5 = PDFName::GetValue_abi_cxx11_(pPVar4);
          std::__cxx11::string::string((string *)&local_e0,(string *)psVar5);
          bVar1 = PDFDictionary::Exists((PDFDictionary *)this_local,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pPVar4 = RefCountPtr<PDFName>::GetPtr((RefCountPtr<PDFName> *)local_70);
            pPVar3 = RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_a0);
            PDFDictionary::Insert((PDFDictionary *)this_local,pPVar4,pPVar3);
          }
          aKey.super_RefCountPtr<PDFName>.mValue._0_4_ = 0;
        }
        RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_a0);
      }
      PDFObjectCastPtr<PDFName>::~PDFObjectCastPtr((PDFObjectCastPtr<PDFName> *)local_70);
    } while ((int)aKey.super_RefCountPtr<PDFName>.mValue == 0);
    EVar2 = DecreaseAndCheckDepth(this);
    if (EVar2 != eSuccess) {
      local_4c = -1;
    }
    if (((token.field_2._M_local_buf[0xf] & 1U) == 0) || (local_4c != 0)) {
      if ((PDFDictionary *)this_local != (PDFDictionary *)0x0) {
        (*(((PDFDictionary *)this_local)->super_PDFObject).super_RefCountObject._vptr_RefCountObject
          [1])();
      }
      pTVar6 = Trace::DefaultTrace();
      std::__cxx11::string::substr((ulong)local_100,(ulong)local_48);
      uVar7 = std::__cxx11::string::c_str();
      Trace::TraceToLog(pTVar6,
                        "PDFObjectParser::ParseDictionary, failure to parse dictionary, didn\'t find end of array or failure to parse dictionary member object. token = %s"
                        ,uVar7);
      std::__cxx11::string::~string(local_100);
      this_local = (PDFObjectParser *)0x0;
    }
  }
  else {
    this_local = (PDFObjectParser *)0x0;
  }
  aKey.super_RefCountPtr<PDFName>.mValue._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (PDFObject *)this_local;
}

Assistant:

PDFObject* PDFObjectParser::ParseDictionary()
{
	PDFDictionary* aDictionary;
	bool dictionaryEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	aDictionary = new PDFDictionary();

	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		dictionaryEndEncountered = (scDoubleRightAngle == token);
		if(dictionaryEndEncountered)
			break;

		ReturnTokenToBuffer(token);

		// Parse Key
		PDFObjectCastPtr<PDFName> aKey(ParseNewObject());
		if(!aKey)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}


		// Parse Value
		RefCountPtr<PDFObject> aValue = ParseNewObject();
		if(!aValue)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}
	

		// all good. i'm gonna be forgiving here and allow skipping duplicate keys. cause it happens
		if(!aDictionary->Exists(aKey->GetValue()))
			aDictionary->Insert(aKey.GetPtr(),aValue.GetPtr());
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;
		
	if(dictionaryEndEncountered && PDFHummus::eSuccess == status)
	{
		return aDictionary;
	}
	else
	{
		delete aDictionary;
		TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse dictionary, didn't find end of array or failure to parse dictionary member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}